

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::printLine<std::__cxx11::string>
               (char *text,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string_view text_00;
  undefined1 auVar1 [16];
  undefined1 local_38 [8];
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char *text_local;
  
  message.field_2._8_8_ = args;
  tinyformat::format<std::__cxx11::string>
            ((string *)local_38,(tinyformat *)text,(char *)args,in_RCX);
  auVar1 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
  text_00._M_str = auVar1._8_8_;
  text_00._M_len = (size_t)text_00._M_str;
  printLine(auVar1._0_8_,text_00);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void printLine(const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		printLine(message);
	}